

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cpp
# Opt level: O1

VerySimpleReadOnlyString __thiscall
Strings::VerySimpleReadOnlyString::splitFrom
          (VerySimpleReadOnlyString *this,VerySimpleReadOnlyString *find,bool includeFind)

{
  uint uVar1;
  char *__s;
  uint uVar2;
  uint uVar3;
  size_t sVar4;
  char in_CL;
  undefined7 in_register_00000011;
  ulong uVar5;
  ulong extraout_RDX;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  VerySimpleReadOnlyString VVar9;
  
  uVar1 = find->length;
  __s = find->data;
  uVar8 = *(uint *)((long *)CONCAT71(in_register_00000011,includeFind) + 1);
  uVar5 = 0;
  uVar2 = 0;
  do {
    uVar6 = uVar2;
    if (uVar2 < uVar1) {
      uVar6 = uVar1;
    }
    uVar7 = 0;
    while( true ) {
      uVar3 = uVar1;
      if (uVar6 + (int)uVar5 == uVar7) goto LAB_00113443;
      if (*(char *)(*(long *)CONCAT71(in_register_00000011,includeFind) + (ulong)uVar7) !=
          __s[uVar2 + uVar7]) break;
      uVar7 = uVar7 + 1;
      uVar3 = uVar2;
      if (uVar8 == uVar7) {
LAB_00113443:
        if (uVar3 == uVar1) {
          if (in_CL == '\0') {
            this->data = "";
            this->length = 0;
          }
          else {
            this->data = __s;
            this->length = uVar1;
            find->data = __s + (int)uVar1;
            find->length = 0;
          }
        }
        else {
          uVar8 = uVar8 + uVar3;
          if (in_CL != '\0') {
            uVar3 = uVar8;
          }
          this->data = __s;
          if (uVar3 == 0xffffffff) {
            if (__s == (char *)0x0) {
              uVar3 = 0;
            }
            else {
              sVar4 = strlen(__s);
              uVar3 = (uint)sVar4;
              uVar5 = extraout_RDX;
            }
          }
          this->length = uVar3;
          find->data = __s + (int)uVar8;
          find->length = uVar1 - uVar8;
        }
        VVar9._8_8_ = uVar5;
        VVar9.data = (tCharPtr)this;
        return VVar9;
      }
    }
    uVar2 = uVar2 + 1;
    uVar5 = (ulong)((int)uVar5 - 1);
  } while( true );
}

Assistant:

const VerySimpleReadOnlyString VerySimpleReadOnlyString::splitFrom(const VerySimpleReadOnlyString & find, const bool includeFind)
	{
	    const unsigned int pos = Find(find);
	    if (pos == (unsigned int)length)
	    {
	        if (includeFind)
	        {
	            VerySimpleReadOnlyString ret(*this);
                (void)Mutate(data + length, 0);
	            return ret;
	        }
	        return VerySimpleReadOnlyString("", 0);
	    }
	    const int size = pos + find.length;
	    VerySimpleReadOnlyString ret(data, includeFind ? size : pos);
        (void)Mutate(data + size, length - size);
	    return ret;
	}